

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O2

void helper_crypto_sha512h2_arm(void *vd,void *vn,void *vm)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint64_t *rm;
  uint64_t *rn;
  
  uVar1 = *vm;
  uVar2 = *(ulong *)((long)vm + 8);
  uVar3 = ((uVar1 << 0x19 | uVar1 >> 0x27) ^
          (uVar1 << 0x1e | uVar1 >> 0x22) ^ (uVar1 << 0x24 | uVar1 >> 0x1c)) +
          *(long *)((long)vd + 8) + ((*vn | uVar2) & uVar1 | uVar2 & *vn);
  *(ulong *)vd = ((uVar1 | uVar3) & uVar2 | uVar3 & uVar1) + *vd +
                 ((uVar3 * 0x2000000 | uVar3 >> 0x27) ^
                 (uVar3 * 0x40000000 | uVar3 >> 0x22) ^ (uVar3 << 0x24 | uVar3 >> 0x1c));
  *(ulong *)((long)vd + 8) = uVar3;
  return;
}

Assistant:

void HELPER(crypto_sha512h2)(void *vd, void *vn, void *vm)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    uint64_t *rm = vm;
    uint64_t d0 = rd[0];
    uint64_t d1 = rd[1];

    d1 += S0_512(rm[0]) + maj512(rn[0], rm[1], rm[0]);
    d0 += S0_512(d1) + maj512(d1, rm[0], rm[1]);

    rd[0] = d0;
    rd[1] = d1;
}